

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.h
# Opt level: O2

void __thiscall
GCPtr<symbols::FunctionObject>::GCPtr(GCPtr<symbols::FunctionObject> *this,FunctionObject *t)

{
  iterator iVar1;
  GCInfo<symbols::FunctionObject> gcObj;
  value_type local_20;
  
  if (first) {
    atexit(shutdown);
  }
  first = false;
  iVar1 = findPtrInfo(this,t);
  if (iVar1._M_node == (_List_node_base *)&gclist_abi_cxx11_) {
    local_20.refcount = 1;
    local_20.memPtr = t;
    std::__cxx11::
    list<GCInfo<symbols::FunctionObject>,_std::allocator<GCInfo<symbols::FunctionObject>_>_>::
    push_front(&gclist_abi_cxx11_,&local_20);
  }
  else {
    *(int *)&iVar1._M_node[1]._M_next = *(int *)&iVar1._M_node[1]._M_next + 1;
  }
  this->addr = t;
  return;
}

Assistant:

GCPtr(T *t=nullptr){

        if(first) atexit(shutdown);
        first = false;

        typename list<GCInfo<T>>::iterator p;
        p = findPtrInfo(t);

        if(p != gclist.end())
            p->refcount++;
        else{

            GCInfo<T> gcObj(t);
            gclist.push_front(gcObj);
        }
        addr = t;
        #ifdef DISPLAY
           cout << "Constructing GCPtr. " << endl;
        #endif
    }